

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void readrle(BinarySource *bs,termline *ldata,
            _func_void_BinarySource_ptr_termchar_ptr_termline_ptr_unsigned_long_ptr *readliteral)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  wchar_t wVar5;
  long lVar6;
  bool bVar7;
  unsigned_long state;
  unsigned_long local_40;
  size_t local_38;
  
  local_40 = 0;
  lVar6 = 0;
  do {
    while( true ) {
      wVar5 = (wchar_t)lVar6;
      if (ldata->cols <= wVar5) {
        if (wVar5 == ldata->cols) {
          return;
        }
        __assert_fail("n == ldata->cols",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0x337,
                      "void readrle(BinarySource *, termline *, void (*)(BinarySource *, termchar *, termline *, unsigned long *))"
                     );
      }
      bVar1 = BinarySource_get_byte(bs->binarysource_);
      if (-1 < (char)bVar1) break;
      local_38 = bs->pos;
      uVar3 = (ulong)(bVar1 - 0x7e);
      lVar6 = (long)wVar5;
      lVar4 = lVar6 << 5;
      while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
        if (ldata->cols <= lVar6) {
          __assert_fail("n < ldata->cols",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x326,
                        "void readrle(BinarySource *, termline *, void (*)(BinarySource *, termchar *, termline *, unsigned long *))"
                       );
        }
        bs->pos = local_38;
        (*readliteral)(bs,(termchar *)((long)&ldata->chars->chr + lVar4),ldata,&local_40);
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 0x20;
      }
    }
    lVar6 = (long)wVar5;
    iVar2 = bVar1 + 1;
    lVar4 = lVar6 << 5;
    while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
      if (ldata->cols <= lVar6) {
        __assert_fail("n < ldata->cols",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0x330,
                      "void readrle(BinarySource *, termline *, void (*)(BinarySource *, termchar *, termline *, unsigned long *))"
                     );
      }
      (*readliteral)(bs,(termchar *)((long)&ldata->chars->chr + lVar4),ldata,&local_40);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x20;
    }
  } while( true );
}

Assistant:

static void readrle(BinarySource *bs, termline *ldata,
                    void (*readliteral)(BinarySource *bs, termchar *c,
                                        termline *ldata, unsigned long *state))
{
    int n = 0;
    unsigned long state = 0;

    while (n < ldata->cols) {
        int hdr = get_byte(bs);

        if (hdr >= 0x80) {
            /* A run. */

            size_t pos = bs->pos, count = hdr + 2 - 0x80;
            while (count--) {
                assert(n < ldata->cols);
                bs->pos = pos;
                readliteral(bs, ldata->chars + n, ldata, &state);
                n++;
            }
        } else {
            /* Just a sequence of consecutive literals. */

            int count = hdr + 1;
            while (count--) {
                assert(n < ldata->cols);
                readliteral(bs, ldata->chars + n, ldata, &state);
                n++;
            }
        }
    }

    assert(n == ldata->cols);
}